

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flash.c
# Opt level: O0

void write_byte_flash(gbamem_t *mem,gbabus_t *bus,uint32_t address,uint8_t value)

{
  int iVar1;
  uint uVar2;
  byte in_CL;
  uint in_EDX;
  ushort *in_RSI;
  long in_RDI;
  uint32_t index_2;
  uint32_t index_1;
  uint32_t index;
  uint32_t erase_address;
  uint32_t block;
  uint32_t start;
  gbabus_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_30;
  uint local_2c;
  uint local_20;
  
  switch(*(undefined4 *)(in_RDI + 0x48038)) {
  case 0:
  case 3:
    if (in_EDX != 0xe005555) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/flash.c"
              ,0x6b);
      fprintf(_stderr,
              "FLASH_[CMD_READY/CHIP_ID] Tried to write to address that wasn\'t 0xE005555! (0x%08X)\n\x1b[0;m"
              ,(ulong)in_EDX);
      exit(1);
    }
    if (in_CL == 0xf0) {
      *(undefined4 *)(in_RDI + 0x48038) = 0;
    }
    else {
      *(uint *)(in_RDI + 0x4803c) = (uint)in_CL;
      *(undefined4 *)(in_RDI + 0x48038) = 1;
    }
    break;
  case 1:
    if (in_EDX != 0xe002aaa) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/flash.c"
              ,0x76);
      fprintf(_stderr,
              "FLASH_CMD_1: Tried to write to address that wasn\'t 0xE002AAA! (0x%08X)\n\x1b[0;m",
              (ulong)in_EDX);
      exit(1);
    }
    *(int *)(in_RDI + 0x4803c) = *(int *)(in_RDI + 0x4803c) << 8;
    *(uint *)(in_RDI + 0x4803c) = (uint)in_CL | *(uint *)(in_RDI + 0x4803c);
    *(undefined4 *)(in_RDI + 0x48038) = 2;
    break;
  case 2:
    if (in_EDX != 0xe005555) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/flash.c"
              ,0x7e);
      fprintf(_stderr,
              "FLASH_CMD_2: Tried to write to address that wasn\'t 0xE005555! (0x%08X)\n\x1b[0;m",
              (ulong)in_EDX);
      exit(1);
    }
    *(int *)(in_RDI + 0x4803c) = *(int *)(in_RDI + 0x4803c) << 8;
    *(uint *)(in_RDI + 0x4803c) = (uint)in_CL | *(uint *)(in_RDI + 0x4803c);
    complete_flash_command
              ((gbamem_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    break;
  case 4:
    if (in_EDX != 0xe005555) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/flash.c"
              ,0x86);
      fprintf(_stderr,
              "FLASH_ERASE Tried to write to address that wasn\'t 0xE005555! (0x%08X)\n\x1b[0;m",
              (ulong)in_EDX);
      exit(1);
    }
    *(uint *)(in_RDI + 0x4803c) = (uint)in_CL;
    *(undefined4 *)(in_RDI + 0x48038) = 5;
    break;
  case 5:
    if (in_EDX != 0xe002aaa) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/flash.c"
              ,0x8d);
      fprintf(_stderr,
              "FLASH_ERASE_1: Tried to write to address that wasn\'t 0xE002AAA! (0x%08X)\n\x1b[0;m",
              (ulong)in_EDX);
      exit(1);
    }
    *(int *)(in_RDI + 0x4803c) = *(int *)(in_RDI + 0x4803c) << 8;
    *(uint *)(in_RDI + 0x4803c) = (uint)in_CL | *(uint *)(in_RDI + 0x4803c);
    *(undefined4 *)(in_RDI + 0x48038) = 6;
    break;
  case 6:
    *(int *)(in_RDI + 0x4803c) = *(int *)(in_RDI + 0x4803c) << 8;
    *(uint *)(in_RDI + 0x4803c) = (uint)in_CL | *(uint *)(in_RDI + 0x4803c);
    if ((in_EDX == 0xe005555) && (*(int *)(in_RDI + 0x4803c) == 0xaa5510)) {
      memset(*(void **)(in_RDI + 0x48018),0xff,*(size_t *)(in_RDI + 0x48010));
      in_RSI[1] = *in_RSI;
      *in_RSI = *in_RSI & 0xfffe;
      *(undefined1 *)(in_RDI + 0x48020) = 1;
    }
    else {
      for (local_20 = 0; local_20 < 0x1000; local_20 = local_20 + 1) {
        if (*(int *)(in_RSI + 0x68) == 4) {
          iVar1 = (uint)*(byte *)(in_RDI + 0x48040) * 0xffff;
        }
        else {
          iVar1 = 0;
        }
        uVar2 = (in_EDX & 0xf000 | local_20) + iVar1;
        if (*(ulong *)(in_RDI + 0x48010) <= (ulong)uVar2) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/flash.c"
                  ,0xa8);
          fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
                  "Out of bounds access to backup!");
          exit(1);
        }
        *(undefined1 *)(*(long *)(in_RDI + 0x48018) + (ulong)uVar2) = 0xff;
      }
      *(undefined1 *)(in_RDI + 0x48020) = 1;
    }
    *(undefined4 *)(in_RDI + 0x48038) = 0;
    break;
  case 7:
    if (*(int *)(in_RDI + 0x48044) == 0) {
      *(uint *)(in_RDI + 0x48044) = in_EDX;
    }
    local_2c = in_EDX & 0xffff;
    if ((*(int *)(in_RSI + 0x68) == 4) && (*(char *)(in_RDI + 0x48040) == '\x01')) {
      local_2c = local_2c + 0xffff;
    }
    if (*(ulong *)(in_RDI + 0x48010) <= (ulong)local_2c) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/flash.c"
              ,0xbc);
      fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m","Out of bounds access to backup!")
      ;
      exit(1);
    }
    *(byte *)(*(long *)(in_RDI + 0x48018) + (ulong)local_2c) = in_CL;
    if (in_EDX - 0x7f == *(int *)(in_RDI + 0x48044)) {
      *in_RSI = in_RSI[1];
      *(undefined4 *)(in_RDI + 0x48044) = 0;
      *(undefined4 *)(in_RDI + 0x48038) = 0;
    }
    *(undefined1 *)(in_RDI + 0x48020) = 1;
    break;
  case 8:
    local_30 = in_EDX & 0xffff;
    if ((*(int *)(in_RSI + 0x68) == 4) && (*(char *)(in_RDI + 0x48040) == '\x01')) {
      local_30 = local_30 + 0xffff;
    }
    *(byte *)(*(long *)(in_RDI + 0x48018) + (ulong)local_30) = in_CL;
    *(undefined4 *)(in_RDI + 0x48038) = 0;
    *(undefined1 *)(in_RDI + 0x48020) = 1;
    break;
  case 9:
    if (in_EDX != 0xe000000) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/flash.c"
              ,0xd6);
      fprintf(_stderr,"Unimplemented: BANK_SWITCH: [0x%08X] = 0x%02X\n\x1b[0;m",(ulong)in_EDX,
              (ulong)in_CL);
      exit(1);
    }
    if (1 < in_CL) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/flash.c"
              ,0xd2);
      fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
              "Tried to switch flash bank to nonexistent bank (>1)");
      exit(1);
    }
    *(byte *)(in_RDI + 0x48040) = in_CL;
    *(undefined4 *)(in_RDI + 0x48038) = 0;
  }
  return;
}

Assistant:

void write_byte_flash(gbamem_t* mem, gbabus_t* bus, word address, byte value) {
#ifdef FLASH_VERBOSE_LOG
    printf("%d [0x%08X] = 0x%02X\n", mem->flash_state, address, value);
#endif
    switch (mem->flash_state) {
        case FLASH_READY:
        case FLASH_CHIP_ID:
            if (address != 0xE005555) {
                logfatal("FLASH_[CMD_READY/CHIP_ID] Tried to write to address that wasn't 0xE005555! (0x%08X)", address)
            }
            if (value == 0xF0) {
                mem->flash_state = FLASH_READY;
            } else {
                mem->flash_command = value;
                mem->flash_state = FLASH_CMD_1;
            }
            break;
        case FLASH_CMD_1:
            if (address != 0xE002AAA) {
                logfatal("FLASH_CMD_1: Tried to write to address that wasn't 0xE002AAA! (0x%08X)", address)
            }
            mem->flash_command <<= 8;
            mem->flash_command |= value;
            mem->flash_state = FLASH_CMD_2;
            break;
        case FLASH_CMD_2:
            if (address != 0xE005555) {
                logfatal("FLASH_CMD_2: Tried to write to address that wasn't 0xE005555! (0x%08X)", address)
            }
            mem->flash_command <<= 8;
            mem->flash_command |= value;
            complete_flash_command(mem, bus);
            break;
        case FLASH_ERASE:
            if (address != 0xE005555) {
                logfatal("FLASH_ERASE Tried to write to address that wasn't 0xE005555! (0x%08X)", address)
            }
            mem->flash_command = value;
            mem->flash_state = FLASH_ERASE_1;
            break;
        case FLASH_ERASE_1:
            if (address != 0xE002AAA) {
                logfatal("FLASH_ERASE_1: Tried to write to address that wasn't 0xE002AAA! (0x%08X)", address)
            }
            mem->flash_command <<= 8;
            mem->flash_command |= value;
            mem->flash_state = FLASH_ERASE_2;
            break;
        case FLASH_ERASE_2:
            mem->flash_command <<= 8;
            mem->flash_command |= value;

            if (address == 0xE005555 && mem->flash_command == FLASHC_ERASE_ENTIRE_CHIP) {
#ifdef FLASH_VERBOSE_LOG
                printf("FLASHC_ERASE_ENTIRE_CHIP\n");
#endif
                memset(mem->backup, 0xFF, mem->backup_size);
                bus->ime_temp.raw = bus->interrupt_master_enable.raw;
                bus->interrupt_master_enable.enable = false;
                mem->backup_dirty = true;
            } else {
#ifdef FLASH_VERBOSE_LOG
                printf("FLASHC_ERASE_BLOCK\n");
#endif
                word start = address & 0x000F000;
                // TODO: Replace with memset?
                for (word block = 0x000; block < 0x1000; block++) {
                    word erase_address = start | block;
                    word index = erase_address + (bus->backup_type == FLASH128K ? mem->flash_bank * 0xFFFF : 0);
                    unimplemented(index >= mem->backup_size, "Out of bounds access to backup!")
                    mem->backup[index] = 0xFF;
                }
                mem->backup_dirty = true;
            }
            // The games are told to wait until a given value == 0xFF
            // Since we're erasing by overwriting with 0xFFs, we can just go back into FLASH_READY mode
#ifdef FLASH_VERBOSE_LOG
            printf("FLASH_READY\n");
#endif
            mem->flash_state = FLASH_READY;
            break;
        case FLASH_ERASE_WRITE_SECTOR: {
            if (mem->flash_erase_write_sector_first_address == 0) {
                mem->flash_erase_write_sector_first_address = address;
            }
            word index = address & 0xFFFF;
            if (bus->backup_type == FLASH128K && mem->flash_bank == 1) {
                index += 0xFFFF;
            }
            unimplemented(index >= mem->backup_size, "Out of bounds access to backup!")
            mem->backup[index] = value;
            if ((address - 0x7F) == mem->flash_erase_write_sector_first_address) {
                bus->interrupt_master_enable.raw = bus->ime_temp.raw;
                mem->flash_erase_write_sector_first_address = 0;
                mem->flash_state = FLASH_READY;
            }
            mem->backup_dirty = true;
            break;
        }
        case FLASH_WRITE_SINGLE_BYTE: {
            word index = address & 0xFFFF;
            if (bus->backup_type == FLASH128K && mem->flash_bank == 1) {
                index += 0xFFFF;
            }
            mem->backup[index] = value;
            mem->flash_state = FLASH_READY;
            mem->backup_dirty = true;
            break;
        }
        case FLASH_BANKSWITCH:
            if (address == 0xE000000) {
                unimplemented(value > 1, "Tried to switch flash bank to nonexistent bank (>1)")
                mem->flash_bank = value;
                mem->flash_state = FLASH_READY;
            } else {
                logfatal("Unimplemented: BANK_SWITCH: [0x%08X] = 0x%02X", address, value)
            }
            break;
    }
}